

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O1

void Abc_NtkChangePerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pNode;
  int iVar1;
  int iVar2;
  Mio_Cell2_t *pCells;
  Vec_Int_t *vInfo;
  Vec_Int_t *vFirst;
  Vec_Ptr_t *vFanout;
  void **ppvVar3;
  Vec_Ptr_t *vFanout2;
  Vec_Int_t *vTemp;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  float local_84;
  uint local_80;
  uint local_7c;
  long local_78;
  int fNeedInv;
  timespec ts;
  int nCells;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    local_78 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_78 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pCells = Mio_CollectRootsNewDefault2(6,&nCells,0);
  vInfo = Abc_NtkPrecomputeCellPairs(pCells,nCells);
  vFirst = Abc_NtkPrecomputeFirsts(pCells,nCells);
  vFanout = (Vec_Ptr_t *)malloc(0x10);
  vFanout->nCap = 100;
  vFanout->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vFanout->pArray = ppvVar3;
  vFanout2 = (Vec_Ptr_t *)malloc(0x10);
  vFanout2->nCap = 100;
  vFanout2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vFanout2->pArray = ppvVar3;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 100;
  vTemp->nSize = 0;
  piVar4 = (int *)malloc(400);
  vTemp->pArray = piVar4;
  pVVar5 = pNtk->vObjs;
  if (pVVar5->nSize < 1) {
    local_80 = 0;
    local_84 = 0.0;
    local_7c = 0;
  }
  else {
    lVar6 = 0;
    local_84 = 0.0;
    local_7c = 0;
    local_80 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar5->pArray[lVar6];
      if ((((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
          ((1 < (pNode->vFanins).nSize || (iVar1 = Abc_NodeIsInv(pNode), iVar1 != 0)))) &&
         ((iVar1 = Abc_ObjHasDupFanouts(pNode), iVar1 == 0 &&
          (iVar1 = Abc_ObjChangeEval(pNode,vInfo,vFirst,(int)pCells[3].AreaW,&fNeedInv), 0 < iVar1))
         )) {
        local_7c = local_7c + 1;
        iVar2 = Abc_NodeIsInv(pNode);
        local_80 = local_80 + iVar2;
        local_84 = (float)((int)local_84 + iVar1);
        Abc_ObjChangePerform(pNode,vInfo,vFirst,fNeedInv,vTemp,vFanout,vFanout2,pCells);
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar6 < pVVar5->nSize);
    local_84 = (float)(int)local_84;
  }
  if (vFanout2->pArray != (void **)0x0) {
    free(vFanout2->pArray);
    vFanout2->pArray = (void **)0x0;
  }
  free(vFanout2);
  if (vFanout->pArray != (void **)0x0) {
    free(vFanout->pArray);
    vFanout->pArray = (void **)0x0;
  }
  free(vFanout);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  if (vFirst->pArray != (int *)0x0) {
    free(vFirst->pArray);
    vFirst->pArray = (int *)0x0;
  }
  if (vFirst != (Vec_Int_t *)0x0) {
    free(vFirst);
  }
  if (vInfo->pArray != (int *)0x0) {
    free(vInfo->pArray);
    vInfo->pArray = (int *)0x0;
  }
  if (vInfo != (Vec_Int_t *)0x0) {
    free(vInfo);
  }
  if (pCells != (Mio_Cell2_t *)0x0) {
    free(pCells);
  }
  if (fVerbose != 0) {
    printf("Total gain in area = %6.2f after %d changes (including %d inverters). ",
           (double)(local_84 / 1000.0),(ulong)local_7c,(ulong)local_80);
    iVar2 = 3;
    iVar1 = clock_gettime(3,(timespec *)&ts);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar2,"%s =","Time");
    Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar6 + local_78) / 1000000.0);
  }
  return;
}

Assistant:

void Abc_NtkChangePerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, fNeedInv, nCells, Gain, GainAll = 0, Count = 0, CountInv = 0;
    Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
    Vec_Int_t * vInfo = Abc_NtkPrecomputeCellPairs( pCells, nCells );
    Vec_Int_t * vFirst = Abc_NtkPrecomputeFirsts( pCells, nCells );

    Vec_Ptr_t * vFanout = Vec_PtrAlloc( 100 );
    Vec_Ptr_t * vFanout2 = Vec_PtrAlloc( 100 );
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    Abc_Obj_t * pObj;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) < 2 && !Abc_NodeIsInv(pObj) )
            continue;
        if ( Abc_ObjHasDupFanouts(pObj) )
            continue;
        Gain = Abc_ObjChangeEval( pObj, vInfo, vFirst, (int)pCells[3].AreaW, &fNeedInv );
        if ( Gain <= 0 )
            continue;
        //printf( "Obj %d\n", Abc_ObjId(pObj) );
        Count++;
        CountInv += Abc_NodeIsInv(pObj);
        GainAll += Gain;
        Abc_ObjChangePerform( pObj, vInfo, vFirst, fNeedInv, vTemp, vFanout, vFanout2, pCells );
    }
    Vec_PtrFree( vFanout2 );
    Vec_PtrFree( vFanout );
    Vec_IntFree( vTemp );

    Vec_IntFree( vFirst );
    Vec_IntFree( vInfo );
    ABC_FREE( pCells );

    if ( fVerbose )
        printf( "Total gain in area = %6.2f after %d changes (including %d inverters). ", Scl_Int2Flt(GainAll), Count, CountInv );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}